

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O3

void xm_vibrato(xm_context_t *ctx,xm_channel_context_t *ch,uint8_t param)

{
  uint16_t uVar1;
  undefined3 in_register_00000011;
  float fVar2;
  
  uVar1 = (short)(CONCAT31(in_register_00000011,param) >> 4) + ch->vibrato_ticks;
  ch->vibrato_ticks = uVar1;
  fVar2 = xm_waveform(ch->vibrato_waveform,(uint8_t)uVar1);
  ch->vibrato_note_offset = ((float)(param & 0xf) * fVar2 * -2.0) / 15.0;
  xm_update_frequency(ctx,ch);
  return;
}

Assistant:

static void xm_vibrato(xm_context_t* ctx, xm_channel_context_t* ch, uint8_t param) {
	ch->vibrato_ticks += (param >> 4);
	ch->vibrato_note_offset =
		-2.f
		* xm_waveform(ch->vibrato_waveform, ch->vibrato_ticks)
		* (float)(param & 0x0F) / (float)0xF;
	xm_update_frequency(ctx, ch);
}